

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xinclude(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  xmlDocPtr pxVar8;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int *piVar9;
  uint *puVar10;
  int n_doc;
  uint uVar11;
  undefined4 uVar12;
  xmlNodePtr in_RSI;
  xmlNodePtr pxVar13;
  int n_data;
  int test_ret_3;
  undefined4 *puVar14;
  int n_flags;
  uint uVar15;
  int test_ret_2;
  int test_ret;
  int test_ret_1;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xinclude : 9 of 13 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlXIncludeGetLastError(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXIncludeGetLastError");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar11 = 0;
  local_38 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar8 = gen_xmlDocPtr(uVar11,(int)in_RSI);
    xmlXIncludeProcess(pxVar8);
    call_tests = call_tests + 1;
    if (((pxVar8 != (xmlDocPtr)0x0) && (api_doc != pxVar8)) && (pxVar8->doc != api_doc)) {
      xmlFreeDoc(pxVar8);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcess",(ulong)(uint)(iVar4 - iVar3));
      local_38 = local_38 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar11;
      printf(" %d");
      putchar(10);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar11 = 0;
  do {
    puVar10 = &DAT_00158240;
    pxVar13 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_xmlDocPtr(uVar11,iVar4);
      in_RSI = (xmlNodePtr)(ulong)*puVar10;
      xmlXIncludeProcessFlags(pxVar8);
      call_tests = call_tests + 1;
      if (((pxVar8 != (xmlDocPtr)0x0) && (api_doc != pxVar8)) && (pxVar8->doc != api_doc)) {
        xmlFreeDoc(pxVar8);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      iVar5 = (int)pxVar13;
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessFlags",(ulong)(uint)(iVar4 - iVar3));
        local_34 = local_34 + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar13;
      }
      uVar15 = iVar5 + 1;
      pxVar13 = (xmlNodePtr)(ulong)uVar15;
      puVar10 = puVar10 + 1;
    } while (uVar15 != 4);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar11 = 0;
  do {
    uVar15 = 0;
    do {
      pxVar13 = (xmlNodePtr)0x0;
      do {
        iVar4 = (int)in_RSI;
        iVar3 = xmlMemBlocks();
        pxVar8 = gen_xmlDocPtr(uVar11,iVar4);
        in_RSI = (xmlNodePtr)0xffffffff;
        if (uVar15 < 4) {
          in_RSI = (xmlNodePtr)(ulong)(uint)(&DAT_00158240)[uVar15];
        }
        piVar9 = &call_tests;
        iVar4 = (int)pxVar13;
        if (iVar4 != 0) {
          if (iVar4 == 1) {
            piVar9 = (int *)0xffffffffffffffff;
          }
          else {
            piVar9 = (int *)0x0;
          }
        }
        xmlXIncludeProcessFlagsData(pxVar8,in_RSI,piVar9);
        call_tests = call_tests + 1;
        if (((pxVar8 != (xmlDocPtr)0x0) && (api_doc != pxVar8)) && (pxVar8->doc != api_doc)) {
          xmlFreeDoc(pxVar8);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar3 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessFlagsData",
                 (ulong)(uint)(iVar5 - iVar3));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar11);
          printf(" %d",(ulong)uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar13;
        }
        pxVar13 = (xmlNodePtr)(ulong)(iVar4 + 1U);
      } while (iVar4 + 1U != 3);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 4);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  function_tests = function_tests + 1;
  uVar11 = 0;
  iVar3 = 0;
  do {
    iVar5 = (int)in_RSI;
    iVar4 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar11,iVar5);
    xmlXIncludeProcessNode(0,in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar11,in_RSI,nr);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcessNode",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      in_RSI = (xmlNodePtr)(ulong)uVar11;
      printf(" %d");
      putchar(10);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  function_tests = function_tests + 1;
  uVar11 = 0;
  iVar4 = 0;
  do {
    iVar6 = (int)in_RSI;
    iVar5 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar11,iVar6);
    xmlXIncludeProcessTree(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar11,in_RSI,nr_00);
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeProcessTree",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar11;
      printf(" %d");
      putchar(10);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  function_tests = function_tests + 1;
  iVar1 = local_38 + (uint)(iVar1 != iVar2) + local_34 + local_3c;
  local_3c = 0;
  uVar11 = 0;
  do {
    puVar14 = &DAT_00158240;
    pxVar13 = (xmlNodePtr)0x0;
    do {
      iVar5 = (int)in_RSI;
      iVar2 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(uVar11,iVar5);
      xmlXIncludeProcessTreeFlags(in_RSI,*puVar14);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar11,in_RSI,nr_01);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      iVar6 = (int)pxVar13;
      if (iVar2 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlags",(ulong)(uint)(iVar5 - iVar2)
              );
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar11);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar13;
      }
      uVar15 = iVar6 + 1;
      pxVar13 = (xmlNodePtr)(ulong)uVar15;
      puVar14 = puVar14 + 1;
    } while (uVar15 != 4);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar11 = 0;
  do {
    uVar15 = 0;
    do {
      pxVar13 = (xmlNodePtr)0x0;
      do {
        iVar6 = (int)in_RSI;
        iVar5 = xmlMemBlocks();
        in_RSI = gen_xmlNodePtr(uVar11,iVar6);
        uVar12 = 0xffffffff;
        if (uVar15 < 4) {
          uVar12 = (&DAT_00158240)[uVar15];
        }
        piVar9 = &call_tests;
        iVar6 = (int)pxVar13;
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            piVar9 = (int *)0xffffffffffffffff;
          }
          else {
            piVar9 = (int *)0x0;
          }
        }
        xmlXIncludeProcessTreeFlagsData(in_RSI,uVar12,piVar9);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar11,in_RSI,nr_02);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar5 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXIncludeProcessTreeFlagsData",
                 (ulong)(uint)(iVar7 - iVar5));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar11);
          printf(" %d",(ulong)uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar13;
        }
        pxVar13 = (xmlNodePtr)(ulong)(iVar6 + 1U);
      } while (iVar6 + 1U != 3);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 4);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  function_tests = function_tests + 1;
  uVar11 = 0;
  iVar5 = 0;
  puVar14 = &DAT_00158240;
  do {
    iVar6 = xmlMemBlocks();
    xmlXIncludeSetFlags(0,*puVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXIncludeSetFlags",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar11);
      putchar(10);
    }
    uVar11 = uVar11 + 1;
    puVar14 = puVar14 + 1;
  } while (uVar11 != 4);
  function_tests = function_tests + 1;
  uVar11 = iVar3 + iVar4 + iVar1 + local_3c + iVar2 + iVar5;
  if (uVar11 != 0) {
    printf("Module xinclude: %d errors\n",(ulong)uVar11);
  }
  return uVar11;
}

Assistant:

static int
test_xinclude(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xinclude : 9 of 13 functions ...\n");
    test_ret += test_xmlXIncludeGetLastError();
    test_ret += test_xmlXIncludeNewContext();
    test_ret += test_xmlXIncludeProcess();
    test_ret += test_xmlXIncludeProcessFlags();
    test_ret += test_xmlXIncludeProcessFlagsData();
    test_ret += test_xmlXIncludeProcessNode();
    test_ret += test_xmlXIncludeProcessTree();
    test_ret += test_xmlXIncludeProcessTreeFlags();
    test_ret += test_xmlXIncludeProcessTreeFlagsData();
    test_ret += test_xmlXIncludeSetErrorHandler();
    test_ret += test_xmlXIncludeSetFlags();
    test_ret += test_xmlXIncludeSetResourceLoader();

    if (test_ret != 0)
	printf("Module xinclude: %d errors\n", test_ret);
    return(test_ret);
}